

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3SegReaderNew
              (int iAge,int bLookup,sqlite3_int64 iStartLeaf,sqlite3_int64 iEndLeaf,
              sqlite3_int64 iEndBlock,char *zRoot,int nRoot,Fts3SegReader **ppReader)

{
  Fts3SegReader *__s;
  int local_44;
  int nExtra;
  Fts3SegReader *pReader;
  char *zRoot_local;
  sqlite3_int64 iEndBlock_local;
  sqlite3_int64 iEndLeaf_local;
  sqlite3_int64 iStartLeaf_local;
  int bLookup_local;
  int iAge_local;
  
  local_44 = 0;
  if (iStartLeaf == 0) {
    if (iEndLeaf != 0) {
      return 0x10b;
    }
    local_44 = nRoot + 0x14;
  }
  __s = (Fts3SegReader *)sqlite3_malloc(local_44 + 0x88);
  if (__s == (Fts3SegReader *)0x0) {
    bLookup_local = 7;
  }
  else {
    memset(__s,0,0x88);
    __s->iIdx = iAge;
    __s->bLookup = bLookup != 0;
    __s->iStartBlock = iStartLeaf;
    __s->iLeafEndBlock = iEndLeaf;
    __s->iEndBlock = iEndBlock;
    if (local_44 == 0) {
      __s->iCurrentBlock = iStartLeaf + -1;
    }
    else {
      __s->aNode = (char *)(__s + 1);
      __s->rootOnly = '\x01';
      __s->nNode = nRoot;
      if (nRoot != 0) {
        memcpy(__s->aNode,zRoot,(long)nRoot);
      }
      memset(__s->aNode + nRoot,0,0x14);
    }
    *ppReader = __s;
    bLookup_local = 0;
  }
  return bLookup_local;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SegReaderNew(
  int iAge,                       /* Segment "age". */
  int bLookup,                    /* True for a lookup only */
  sqlite3_int64 iStartLeaf,       /* First leaf to traverse */
  sqlite3_int64 iEndLeaf,         /* Final leaf to traverse */
  sqlite3_int64 iEndBlock,        /* Final block of segment */
  const char *zRoot,              /* Buffer containing root node */
  int nRoot,                      /* Size of buffer containing root node */
  Fts3SegReader **ppReader        /* OUT: Allocated Fts3SegReader */
){
  Fts3SegReader *pReader;         /* Newly allocated SegReader object */
  int nExtra = 0;                 /* Bytes to allocate segment root node */

  assert( zRoot!=0 || nRoot==0 );
#ifdef CORRUPT_DB
  assert( zRoot!=0 || CORRUPT_DB );
#endif

  if( iStartLeaf==0 ){
    if( iEndLeaf!=0 ) return FTS_CORRUPT_VTAB;
    nExtra = nRoot + FTS3_NODE_PADDING;
  }

  pReader = (Fts3SegReader *)sqlite3_malloc(sizeof(Fts3SegReader) + nExtra);
  if( !pReader ){
    return SQLITE_NOMEM;
  }
  memset(pReader, 0, sizeof(Fts3SegReader));
  pReader->iIdx = iAge;
  pReader->bLookup = bLookup!=0;
  pReader->iStartBlock = iStartLeaf;
  pReader->iLeafEndBlock = iEndLeaf;
  pReader->iEndBlock = iEndBlock;

  if( nExtra ){
    /* The entire segment is stored in the root node. */
    pReader->aNode = (char *)&pReader[1];
    pReader->rootOnly = 1;
    pReader->nNode = nRoot;
    if( nRoot ) memcpy(pReader->aNode, zRoot, nRoot);
    memset(&pReader->aNode[nRoot], 0, FTS3_NODE_PADDING);
  }else{
    pReader->iCurrentBlock = iStartLeaf-1;
  }
  *ppReader = pReader;
  return SQLITE_OK;
}